

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  ZeroCopyInputStream *pZVar1;
  uint8 *puVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  LogMessage *pLVar6;
  int iVar7;
  int iVar8;
  int buffer_size;
  void *void_buffer;
  uint local_a8;
  LogFinisher local_a1;
  uint8 *local_a0;
  LogMessage local_98;
  LogMessage local_60;
  
  if ((int)this->buffer_end_ != (int)this->buffer_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x242);
    pLVar6 = internal::LogMessage::operator<<(&local_60,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar6);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    pZVar1 = this->input_;
    do {
      iVar4 = (*pZVar1->_vptr_ZeroCopyInputStream[2])(pZVar1,&local_a0,&local_a8);
      cVar3 = (char)iVar4;
      if (cVar3 == '\0') break;
    } while (local_a8 == 0);
    if (cVar3 == '\0') {
      this->buffer_ = (uint8 *)0x0;
      this->buffer_end_ = (uint8 *)0x0;
    }
    else {
      this->buffer_ = local_a0;
      this->buffer_end_ = local_a0 + (int)local_a8;
      if ((long)(int)local_a8 < 0) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,599);
        pLVar6 = internal::LogMessage::operator<<(&local_98,"CHECK failed: (buffer_size) >= (0): ");
        internal::LogFinisher::operator=(&local_a1,pLVar6);
        internal::LogMessage::~LogMessage(&local_98);
      }
      iVar4 = this->total_bytes_read_;
      iVar7 = iVar4 - (local_a8 ^ 0x7fffffff);
      if (iVar7 == 0 || iVar4 < (int)(local_a8 ^ 0x7fffffff)) {
        iVar4 = local_a8 + iVar4;
      }
      else {
        this->overflow_bytes_ = iVar7;
        this->buffer_end_ = this->buffer_end_ + -(long)iVar7;
        iVar4 = 0x7fffffff;
      }
      this->total_bytes_read_ = iVar4;
      iVar7 = this->buffer_size_after_limit_;
      puVar2 = this->buffer_end_;
      this->buffer_end_ = puVar2 + iVar7;
      iVar8 = this->current_limit_;
      if (this->total_bytes_limit_ < this->current_limit_) {
        iVar8 = this->total_bytes_limit_;
      }
      iVar5 = iVar4 - iVar8;
      if (iVar5 == 0 || iVar4 < iVar8) {
        this->buffer_size_after_limit_ = 0;
      }
      else {
        this->buffer_size_after_limit_ = iVar5;
        this->buffer_end_ = puVar2 + iVar7 + -(long)iVar5;
      }
    }
  }
  else {
    cVar3 = '\0';
    if ((this->total_bytes_limit_ <= this->total_bytes_read_ - this->buffer_size_after_limit_) &&
       (cVar3 = '\0', this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
      cVar3 = '\0';
    }
  }
  return (bool)cVar3;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}